

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QString * nameFilterForMime(QString *__return_storage_ptr__,QString *mimeType)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_118;
  QStringBuilder<QString,_QLatin1String> local_f8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> local_c8;
  QArrayDataPointer<char16_t> local_98;
  QMimeType mime;
  QMimeDatabase db;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
  local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _db = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::QMimeDatabase(&db);
  _mime = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::mimeTypeForName((QString *)&mime);
  cVar1 = QMimeType::isValid();
  if (cVar1 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    cVar1 = QMimeType::isDefault();
    if (cVar1 == '\0') {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QMimeType::globPatterns();
      QListSpecialMethods<QString>::join
                ((QString *)&local_98,(QListSpecialMethods<QString> *)&local_70,(QChar)0x20);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_70);
      QMimeType::comment();
      local_f8.a.d.size = local_118.size;
      local_f8.a.d.ptr = local_118.ptr;
      local_f8.a.d.d = local_118.d;
      local_118.d = (Data *)0x0;
      local_118.ptr = (char16_t *)0x0;
      local_118.size = 0;
      local_f8.b.m_size = 2;
      local_f8.b.m_data = " (";
      QStringBuilder<QString,_QLatin1String>::QStringBuilder(&local_c8.a,&local_f8);
      local_c8.b = (QString *)&local_98;
      QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>::QStringBuilder
                (&local_70.a,&local_c8);
      local_70.b = L')';
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
      ::convertTo<QString>(__return_storage_ptr__,&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    else {
      QFileDialog::tr(__return_storage_ptr__,"All files (*)",(char *)0x0,-1);
    }
  }
  QMimeType::~QMimeType(&mime);
  QMimeDatabase::~QMimeDatabase(&db);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString nameFilterForMime(const QString &mimeType)
{
    QMimeDatabase db;
    QMimeType mime(db.mimeTypeForName(mimeType));
    if (mime.isValid()) {
        if (mime.isDefault()) {
            return QFileDialog::tr("All files (*)");
        } else {
            const QString patterns = mime.globPatterns().join(u' ');
            return mime.comment() + " ("_L1 + patterns + u')';
        }
    }
    return QString();
}